

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_plot_function(nk_context *ctx,nk_chart_type type,void *userdata,
                     _func_float_void_ptr_int *value_getter,int count,int offset)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float max_value;
  float fVar4;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5f03,
                  "void nk_plot_function(struct nk_context *, enum nk_chart_type, void *, float (*)(void *, int), int, int)"
                 );
  }
  if (value_getter == (_func_float_void_ptr_int *)0x0) {
    __assert_fail("value_getter",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5f04,
                  "void nk_plot_function(struct nk_context *, enum nk_chart_type, void *, float (*)(void *, int), int, int)"
                 );
  }
  if (count != 0) {
    fVar3 = (*value_getter)(userdata,offset);
    max_value = fVar3;
    fVar4 = fVar3;
    iVar1 = offset;
    iVar2 = count;
    if (0 < count) {
      do {
        fVar3 = (*value_getter)(userdata,iVar1);
        if (max_value <= fVar3) {
          max_value = fVar3;
        }
        if (fVar4 <= fVar3) {
          fVar3 = fVar4;
        }
        iVar2 = iVar2 + -1;
        fVar4 = fVar3;
        iVar1 = iVar1 + 1;
      } while (iVar2 != 0);
    }
    iVar1 = nk_chart_begin_colored
                      (ctx,type,(ctx->style).chart.color,(ctx->style).chart.selected_color,count,
                       fVar3,max_value);
    if (iVar1 != 0) {
      if (0 < count) {
        do {
          fVar3 = (*value_getter)(userdata,offset);
          nk_chart_push_slot(ctx,fVar3,0);
          offset = offset + 1;
          count = count + -1;
        } while (count != 0);
      }
      nk_chart_end(ctx);
      return;
    }
  }
  return;
}

Assistant:

NK_API void
nk_plot_function(struct nk_context *ctx, enum nk_chart_type type, void *userdata,
    float(*value_getter)(void* user, int index), int count, int offset)
{
    int i = 0;
    float min_value;
    float max_value;

    NK_ASSERT(ctx);
    NK_ASSERT(value_getter);
    if (!ctx || !value_getter || !count) return;

    max_value = min_value = value_getter(userdata, offset);
    for (i = 0; i < count; ++i) {
        float value = value_getter(userdata, i + offset);
        min_value = NK_MIN(value, min_value);
        max_value = NK_MAX(value, max_value);
    }

    if (nk_chart_begin(ctx, type, count, min_value, max_value)) {
        for (i = 0; i < count; ++i)
            nk_chart_push(ctx, value_getter(userdata, i + offset));
        nk_chart_end(ctx);
    }
}